

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O1

Literal * Shell::Flattening::flatten(Literal *l)

{
  uint uVar1;
  TermList TVar2;
  ulong uVar3;
  bool bVar4;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar5;
  TermList argument;
  TermList ts;
  Stack<Kernel::TermList> local_58;
  
  if (((l->super_Term)._args[0]._content & 8) == 0) {
    local_58._cursor = (TermList *)0x0;
    local_58._end = (TermList *)0x0;
    local_58._capacity = 0;
    local_58._stack = (TermList *)0x0;
    uVar1 = *(uint *)&(l->super_Term).field_0xc & 0xfffffff;
    ts._content = (l->super_Term)._args[uVar1]._content;
    if (((uint)ts._content & 3) != 2) {
      paVar5 = (anon_union_8_2_f154dc0f_for_Term_10 *)((l->super_Term)._args + ((ulong)uVar1 - 1));
      bVar4 = false;
      do {
        TVar2 = flatten(ts);
        if (ts._content != TVar2._content) {
          bVar4 = true;
        }
        if (local_58._cursor == local_58._end) {
          ::Lib::Stack<Kernel::TermList>::expand(&local_58);
        }
        (local_58._cursor)->_content = TVar2._content;
        local_58._cursor = local_58._cursor + 1;
        ts._content = (paVar5->_sort)._content;
        paVar5 = paVar5 + -1;
      } while (((uint)ts._content & 3) != 2);
      if (bVar4) {
        l = Kernel::Literal::create(l,local_58._stack);
      }
    }
    if (local_58._stack != (TermList *)0x0) {
      uVar3 = local_58._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar3 == 0) {
        (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
      }
      else if (uVar3 < 0x11) {
        (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._stack;
      }
      else if (uVar3 < 0x19) {
        (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._stack;
      }
      else if (uVar3 < 0x21) {
        (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
      }
      else if (uVar3 < 0x31) {
        (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
      }
      else if (uVar3 < 0x41) {
        (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
      }
      else {
        operator_delete(local_58._stack,0x10);
      }
    }
  }
  return l;
}

Assistant:

Literal* Flattening::flatten(Literal* l)
{
  if (l->shared()) {
    return l;
  }

  bool flattened = false;
  Stack<TermList> args;
  Term::Iterator terms(l);
  while (terms.hasNext()) {
    TermList argument = terms.next();
    TermList flattenedArgument = flatten(argument);
    if (argument != flattenedArgument) {
      flattened = true;
    }
    args.push(flattenedArgument);
  }

  if (!flattened) {
    return l;
  }

  return Literal::create(l, args.begin());
}